

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int pager_write(PgHdr *pPg)

{
  u8 uVar1;
  ushort uVar2;
  Pgno PVar3;
  Pager *pPager;
  sqlite3_vfs *psVar4;
  sqlite3_file *psVar5;
  sqlite3_io_methods *psVar6;
  long lVar7;
  void *pvVar8;
  ushort uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  undefined8 in_RAX;
  MemJournal *p;
  Bitvec *__s;
  long lVar13;
  u32 uVar14;
  bool bVar15;
  undefined8 local_38;
  
  pPager = pPg->pPager;
  local_38 = in_RAX;
  if (pPager->eState == '\x02') {
    iVar10 = pPager->errCode;
    if (iVar10 == 0) {
      iVar10 = 0;
      if ((pPager->pWal == (Wal *)0x0) && (pPager->journalMode != '\x02')) {
        psVar4 = pPager->pVfs;
        PVar3 = pPager->dbSize;
        __s = (Bitvec *)sqlite3Malloc(0x200);
        if (__s == (Bitvec *)0x0) {
          pPager->pInJournal = (Bitvec *)0x0;
          iVar10 = 7;
          goto LAB_00126175;
        }
        iVar10 = 0;
        memset(__s,0,0x200);
        __s->iSize = PVar3;
        pPager->pInJournal = __s;
        psVar5 = pPager->jfd;
        if (psVar5->pMethods == (sqlite3_io_methods *)0x0) {
          if (pPager->journalMode == '\x04') {
            psVar5->pMethods = (sqlite3_io_methods *)0x0;
            psVar5[1].pMethods = (sqlite3_io_methods *)0x0;
            psVar5[4].pMethods = (sqlite3_io_methods *)0x0;
            psVar5[5].pMethods = (sqlite3_io_methods *)0x0;
            psVar5[2].pMethods = (sqlite3_io_methods *)0x0;
            psVar5[3].pMethods = (sqlite3_io_methods *)0x0;
            psVar5->pMethods = &MemJournalMethods;
          }
          else {
            uVar1 = pPager->tempFile;
            iVar10 = databaseIsUnmoved(pPager);
            if (iVar10 == 0) {
              iVar10 = 0x100e;
              if (uVar1 == '\0') {
                iVar10 = 0x806;
              }
              iVar10 = (*psVar4->xOpen)(psVar4,pPager->zJournal,pPager->jfd,iVar10,(int *)0x0);
            }
          }
        }
        if (iVar10 == 0) {
          pPager->nRec = 0;
          pPager->setMaster = '\0';
          pPager->journalOff = 0;
          pPager->journalHdr = 0;
          iVar10 = writeJournalHdr(pPager);
        }
      }
      if (iVar10 == 0) {
        pPager->eState = '\x03';
      }
      else {
        sqlite3BitvecDestroy(pPager->pInJournal);
        pPager->pInJournal = (Bitvec *)0x0;
      }
    }
LAB_00126175:
    if (iVar10 != 0) {
      return iVar10;
    }
  }
  uVar2 = pPg->flags;
  uVar9 = uVar2 & 0xffdf;
  pPg->flags = uVar9;
  if ((uVar2 & 2) == 0) {
    pPg->flags = uVar9 | 2;
    pcacheManageDirtyList(pPg,'\x02');
  }
  uVar11 = pPg->pgno;
  iVar10 = sqlite3BitvecTest(pPager->pInJournal,uVar11);
  if (iVar10 == 0) {
    uVar12 = 0;
    if (pPager->pWal == (Wal *)0x0) {
      if (uVar11 <= pPager->dbOrigSize) {
        psVar5 = pPager->jfd;
        psVar6 = psVar5->pMethods;
        if (psVar6 != (sqlite3_io_methods *)0x0) {
          lVar7 = pPager->journalOff;
          pvVar8 = pPg->pData;
          uVar14 = pPager->cksumInit;
          if (200 < (long)pPager->pageSize) {
            lVar13 = (long)pPager->pageSize + 200;
            do {
              uVar14 = uVar14 + *(byte *)((long)pvVar8 + lVar13 + -400);
              lVar13 = lVar13 + -200;
            } while (400 < lVar13);
          }
          *(byte *)&pPg->flags = (byte)pPg->flags | 4;
          local_38 = CONCAT44(local_38._4_4_,
                              uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                              uVar11 << 0x18);
          uVar12 = (*psVar6->xWrite)(psVar5,&local_38,4,lVar7);
          if ((uVar12 == 0) &&
             (uVar12 = (*pPager->jfd->pMethods->xWrite)
                                 (pPager->jfd,pvVar8,pPager->pageSize,lVar7 + 4), uVar12 == 0)) {
            local_38 = CONCAT44(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                                uVar14 << 0x18,(undefined4)local_38);
            uVar12 = (*pPager->jfd->pMethods->xWrite)
                               (pPager->jfd,(void *)((long)&local_38 + 4),4,
                                lVar7 + pPager->pageSize + 4);
            if (uVar12 != 0) goto LAB_001262de;
            pPager->journalOff = (long)pPager->pageSize + pPager->journalOff + 8;
            pPager->nRec = pPager->nRec + 1;
            uVar11 = sqlite3BitvecSet(pPager->pInJournal,pPg->pgno);
            uVar12 = addToSavepointBitvecs(pPager,pPg->pgno);
            uVar12 = uVar12 | uVar11;
            bVar15 = uVar12 == 0;
          }
          else {
LAB_001262de:
            bVar15 = false;
          }
          if (!bVar15) {
            return uVar12;
          }
          goto LAB_001261df;
        }
      }
      if (pPager->eState != '\x04') {
        *(byte *)&pPg->flags = (byte)pPg->flags | 4;
        uVar12 = 0;
      }
    }
  }
  else {
    if (pPager->nSavepoint == 0) {
      uVar11 = 0;
      goto LAB_00126202;
    }
    iVar10 = subjRequiresPage(pPg);
    uVar11 = 0;
    uVar12 = 0;
    if (iVar10 == 0) goto LAB_00126202;
  }
LAB_001261df:
  uVar11 = uVar12;
  if ((0 < pPager->nSavepoint) && (iVar10 = subjRequiresPage(pPg), iVar10 != 0)) {
    uVar11 = subjournalPage(pPg);
  }
LAB_00126202:
  if (pPager->dbSize < pPg->pgno) {
    pPager->dbSize = pPg->pgno;
  }
  return uVar11;
}

Assistant:

static int pager_write(PgHdr *pPg){
  Pager *pPager = pPg->pPager;
  int rc = SQLITE_OK;
  int inJournal;

  /* This routine is not called unless a write-transaction has already 
  ** been started. The journal file may or may not be open at this point.
  ** It is never called in the ERROR state.
  */
  assert( pPager->eState==PAGER_WRITER_LOCKED
       || pPager->eState==PAGER_WRITER_CACHEMOD
       || pPager->eState==PAGER_WRITER_DBMOD
  );
  assert( assert_pager_state(pPager) );
  assert( pPager->errCode==0 );
  assert( pPager->readOnly==0 );

  CHECK_PAGE(pPg);

  /* The journal file needs to be opened. Higher level routines have already
  ** obtained the necessary locks to begin the write-transaction, but the
  ** rollback journal might not yet be open. Open it now if this is the case.
  **
  ** This is done before calling sqlite3PcacheMakeDirty() on the page. 
  ** Otherwise, if it were done after calling sqlite3PcacheMakeDirty(), then
  ** an error might occur and the pager would end up in WRITER_LOCKED state
  ** with pages marked as dirty in the cache.
  */
  if( pPager->eState==PAGER_WRITER_LOCKED ){
    rc = pager_open_journal(pPager);
    if( rc!=SQLITE_OK ) return rc;
  }
  assert( pPager->eState>=PAGER_WRITER_CACHEMOD );
  assert( assert_pager_state(pPager) );

  /* Mark the page as dirty.  If the page has already been written
  ** to the journal then we can return right away.
  */
  sqlite3PcacheMakeDirty(pPg);
  inJournal = pageInJournal(pPager, pPg);
  if( inJournal && (pPager->nSavepoint==0 || !subjRequiresPage(pPg)) ){
    assert( !pagerUseWal(pPager) );
  }else{
  
    /* The transaction journal now exists and we have a RESERVED or an
    ** EXCLUSIVE lock on the main database file.  Write the current page to
    ** the transaction journal if it is not there already.
    */
    if( !inJournal && !pagerUseWal(pPager) ){
      assert( pagerUseWal(pPager)==0 );
      if( pPg->pgno<=pPager->dbOrigSize && isOpen(pPager->jfd) ){
        u32 cksum;
        char *pData2;
        i64 iOff = pPager->journalOff;

        /* We should never write to the journal file the page that
        ** contains the database locks.  The following assert verifies
        ** that we do not. */
        assert( pPg->pgno!=PAGER_MJ_PGNO(pPager) );

        assert( pPager->journalHdr<=pPager->journalOff );
        CODEC2(pPager, pPg->pData, pPg->pgno, 7, return SQLITE_NOMEM, pData2);
        cksum = pager_cksum(pPager, (u8*)pData2);

        /* Even if an IO or diskfull error occurs while journalling the
        ** page in the block above, set the need-sync flag for the page.
        ** Otherwise, when the transaction is rolled back, the logic in
        ** playback_one_page() will think that the page needs to be restored
        ** in the database file. And if an IO error occurs while doing so,
        ** then corruption may follow.
        */
        pPg->flags |= PGHDR_NEED_SYNC;

        rc = write32bits(pPager->jfd, iOff, pPg->pgno);
        if( rc!=SQLITE_OK ) return rc;
        rc = sqlite3OsWrite(pPager->jfd, pData2, pPager->pageSize, iOff+4);
        if( rc!=SQLITE_OK ) return rc;
        rc = write32bits(pPager->jfd, iOff+pPager->pageSize+4, cksum);
        if( rc!=SQLITE_OK ) return rc;

        IOTRACE(("JOUT %p %d %lld %d\n", pPager, pPg->pgno, 
                 pPager->journalOff, pPager->pageSize));
        PAGER_INCR(sqlite3_pager_writej_count);
        PAGERTRACE(("JOURNAL %d page %d needSync=%d hash(%08x)\n",
             PAGERID(pPager), pPg->pgno, 
             ((pPg->flags&PGHDR_NEED_SYNC)?1:0), pager_pagehash(pPg)));

        pPager->journalOff += 8 + pPager->pageSize;
        pPager->nRec++;
        assert( pPager->pInJournal!=0 );
        rc = sqlite3BitvecSet(pPager->pInJournal, pPg->pgno);
        testcase( rc==SQLITE_NOMEM );
        assert( rc==SQLITE_OK || rc==SQLITE_NOMEM );
        rc |= addToSavepointBitvecs(pPager, pPg->pgno);
        if( rc!=SQLITE_OK ){
          assert( rc==SQLITE_NOMEM );
          return rc;
        }
      }else{
        if( pPager->eState!=PAGER_WRITER_DBMOD ){
          pPg->flags |= PGHDR_NEED_SYNC;
        }
        PAGERTRACE(("APPEND %d page %d needSync=%d\n",
                PAGERID(pPager), pPg->pgno,
               ((pPg->flags&PGHDR_NEED_SYNC)?1:0)));
      }
    }
  
    /* If the statement journal is open and the page is not in it,
    ** then write the current page to the statement journal.  Note that
    ** the statement journal format differs from the standard journal format
    ** in that it omits the checksums and the header.
    */
    if( pPager->nSavepoint>0 && subjRequiresPage(pPg) ){
      rc = subjournalPage(pPg);
    }
  }

  /* Update the database size and return.
  */
  if( pPager->dbSize<pPg->pgno ){
    pPager->dbSize = pPg->pgno;
  }
  return rc;
}